

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_get.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  
  iVar1 = test_get();
  if (iVar1 == 0) {
    return 0;
  }
  __assert_fail("ret == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/OlehKulykov[P]libnhr/tests/test_get.c"
                ,0xd6,"int main(int, char **)");
}

Assistant:

int main(int argc, char* argv[]) {

	int ret = 0;
#if !defined(NHR_NO_GET) && !defined(NHR_APPVEYOR_CI)
	ret += test_get();
	assert(ret == 0);
#endif

	return ret;
}